

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.c
# Opt level: O1

size_t find_atom(pExecutor exec,char *name)

{
  int iVar1;
  size_t in_RAX;
  char *name_00;
  size_t sVar2;
  size_t found;
  size_t local_18;
  
  local_18 = in_RAX;
  name_00 = normalize_name(name);
  iVar1 = find_place_for_atom(exec,name_00,&local_18);
  free(name_00);
  sVar2 = 0x7ffffffe;
  if (iVar1 == 1) {
    sVar2 = local_18;
  }
  return sVar2;
}

Assistant:

size_t find_atom(pExecutor exec, char *name)
{
    // Create name copy
    char *copy = normalize_name(name);
    size_t found;
    int res = find_place_for_atom(exec, copy, &found);
    free(copy);
    if (res != FIND_PLACE_EXISTS)
        return EXPR_NOT_FOUND;
    return found;
}